

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemo.cpp
# Opt level: O0

void demo2(void)

{
  ostream *this;
  IMLE<1,_1,_FastLinearExpert> imleObj;
  Param param;
  int D;
  int d;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  *in_stack_fffffffffffffb98;
  allocator *paVar1;
  Matrix<double,_1,_1,_0,_1,_1> *in_stack_fffffffffffffba0;
  Scalar *in_stack_fffffffffffffba8;
  string local_450 [48];
  IMLE<1,_1,_FastLinearExpert> *in_stack_fffffffffffffbe0;
  int in_stack_fffffffffffffc84;
  Param *in_stack_fffffffffffffc88;
  IMLE<1,_1,_FastLinearExpert> *in_stack_fffffffffffffc90;
  IMLE<1,_1,_FastLinearExpert> *in_stack_fffffffffffffd00;
  string *in_stack_ffffffffffffff00;
  
  IMLE<1,_1,_FastLinearExpert>::Param::Param(&in_stack_fffffffffffffbe0->param);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::Constant(in_stack_fffffffffffffba8);
  Eigen::Matrix<double,1,1,0,1,1>::operator=(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  this = std::operator<<((ostream *)&std::cout,"\t --- Param constructor: ---");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  IMLE<1,_1,_FastLinearExpert>::IMLE
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc84);
  paVar1 = (allocator *)&stack0xfffffffffffffbaf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_450,"cos1D.xml",paVar1);
  IMLE<1,_1,_FastLinearExpert>::createDefaultParamFile(in_stack_ffffffffffffff00);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffbaf);
  cos1D_testSaveLoadAndParamHandling<IMLE<1,1,FastLinearExpert>>(in_stack_fffffffffffffd00);
  IMLE<1,_1,_FastLinearExpert>::~IMLE(in_stack_fffffffffffffbe0);
  IMLE<1,_1,_FastLinearExpert>::Param::~Param((Param *)0x234b60);
  return;
}

Assistant:

void demo2()
{
    const int d = 1;    //Input dimension
    const int D = 1;    //Output dimension

    //      IMLE Parameters
    IMLE<d,D>::Param param;
    param.Psi0 = IMLE<d,D>::X::Constant(0.1);
    param.sigma0 = 1.0;
    param.p0 = 0.2;

    // Param constructor:
    cout << "\t --- Param constructor: ---" << endl;
    IMLE<d,D> imleObj(param);

    // Default Param File:
    IMLE<d,D>::createDefaultParamFile("cos1D.xml");

    cos1D_testSaveLoadAndParamHandling(imleObj );
}